

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  int iVar1;
  const_iterator it;
  pointer piVar2;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> test;
  string expectedString;
  ostringstream oss;
  vector<int,_std::allocator<int>_> local_210;
  undefined1 *local_1f8;
  size_t local_1f0;
  undefined1 local_1e8 [16];
  undefined1 *local_1d8;
  undefined8 local_1d0;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  size_t local_1b0;
  undefined1 local_1a8 [16];
  undefined8 local_198;
  undefined4 local_190;
  ios_base local_128 [264];
  
  local_198 = 0x300000001;
  local_190 = 0x22;
  __l._M_len = 3;
  __l._M_array = (iterator)&local_198;
  std::vector<int,_std::allocator<int>_>::vector(&local_210,__l,(allocator_type *)&local_1d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test mkString...",0x10);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  local_1f8 = local_1e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"1 3 34","");
  local_1d0 = 0;
  local_1c8[0] = 0;
  local_1d8 = local_1c8;
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&local_198,(string *)&local_1d8,_S_out);
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  if (local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    piVar2 = local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start;
    do {
      if (piVar2 != local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_198," ",1);
      }
      std::ostream::operator<<((ostream *)&local_198,*piVar2);
      piVar2 = piVar2 + 1;
    } while (piVar2 != local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_198);
  std::ios_base::~ios_base(local_128);
  if (local_1f0 == local_1b0) {
    if (local_1f0 != 0) {
      iVar1 = bcmp(local_1f8,local_1b8,local_1f0);
      if (iVar1 != 0) goto LAB_001024ec;
    }
    if (local_1b8 != local_1a8) {
      operator_delete(local_1b8);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"passed!",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    if (local_1f8 != local_1e8) {
      operator_delete(local_1f8);
    }
    if (local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(local_210.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    return 0;
  }
LAB_001024ec:
  __assert_fail("expectedString==Functional::mkString(test)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drugilsberg[P]functional-cpp/test/mkString/main.cpp"
                ,0x12,"int main()");
}

Assistant:

int main(){

    
  
  vector<int> test={1, 3, 34};
  
  cout << "Test mkString..." << endl;
  string expectedString="1 3 34";
  assert(expectedString==Functional::mkString(test));
  cout << "passed!" << endl;
  
  return 0;

}